

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::~cmState(cmState *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer pSVar4;
  pointer pPVar5;
  cmGlobVerificationManager *__ptr;
  
  if ((this->DependencyProvider).super__Optional_base<cmDependencyProvider,_false,_false>._M_payload
      .super__Optional_payload<cmDependencyProvider,_true,_false,_false>.
      super__Optional_payload_base<cmDependencyProvider>._M_engaged == true) {
    std::_Optional_payload_base<cmDependencyProvider>::_M_destroy
              ((_Optional_payload_base<cmDependencyProvider> *)&this->DependencyProvider);
  }
  pcVar2 = (this->BinaryDirectory)._M_dataplus._M_p;
  paVar1 = &(this->BinaryDirectory).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->SourceDirectory)._M_dataplus._M_p;
  paVar1 = &(this->SourceDirectory).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  puVar3 = (this->VarTree).UpPositions.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->VarTree).UpPositions.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  std::vector<cmDefinitions,_std::allocator<cmDefinitions>_>::~vector(&(this->VarTree).Data);
  puVar3 = (this->SnapshotData).UpPositions.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->SnapshotData).UpPositions.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  pSVar4 = (this->SnapshotData).Data.
           super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar4 != (pointer)0x0) {
    operator_delete(pSVar4,(long)(this->SnapshotData).Data.
                                 super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar4);
  }
  puVar3 = (this->PolicyStack).UpPositions.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->PolicyStack).UpPositions.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  pPVar5 = (this->PolicyStack).Data.
           super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar5 != (pointer)0x0) {
    operator_delete(pPVar5,(long)(this->PolicyStack).Data.
                                 super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar5);
  }
  puVar3 = (this->ExecutionListFiles).UpPositions.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->ExecutionListFiles).UpPositions.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->ExecutionListFiles).Data);
  puVar3 = (this->BuildsystemDirectory).UpPositions.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->BuildsystemDirectory).UpPositions.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  std::
  vector<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ::~vector(&(this->BuildsystemDirectory).Data);
  __ptr = (this->GlobVerificationManager)._M_t.
          super___uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmGlobVerificationManager_*,_std::default_delete<cmGlobVerificationManager>_>
          .super__Head_base<0UL,_cmGlobVerificationManager_*,_false>._M_head_impl;
  if (__ptr != (cmGlobVerificationManager *)0x0) {
    std::default_delete<cmGlobVerificationManager>::operator()
              ((default_delete<cmGlobVerificationManager> *)&this->GlobVerificationManager,__ptr);
  }
  (this->GlobVerificationManager)._M_t.
  super___uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmGlobVerificationManager_*,_std::default_delete<cmGlobVerificationManager>_>
  .super__Head_base<0UL,_cmGlobVerificationManager_*,_false>._M_head_impl =
       (cmGlobVerificationManager *)0x0;
  std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::~unique_ptr
            (&this->CacheManager);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->GlobalProperties);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->FlowControlCommands)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->ScriptedCommands)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->BuiltinCommands)._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->EnabledLanguages);
  std::
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
               *)this);
  return;
}

Assistant:

cmState::~cmState() = default;